

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O0

string * formatTime_abi_cxx11_(string *__return_storage_ptr__,time_t seconds)

{
  allocator<char> local_3d;
  float local_3c;
  char local_38 [4];
  float days;
  char formatted [24];
  time_t seconds_local;
  
  local_3c = (float)((double)seconds / 86400.0);
  if (seconds < 0x1e13380) {
    if (seconds < 0x6ebe00) {
      if (seconds < 0x112380) {
        if (seconds < 0x15180) {
          if (seconds < 0xe10) {
            if (seconds < 0x3c) {
              if (seconds < 1) {
                strcpy(local_38,"-");
              }
              else {
                snprintf(local_38,0x18,"%d s",seconds & 0xffffffff);
              }
            }
            else {
              snprintf(local_38,0x18,"%d m",seconds / 0x3c & 0xffffffff);
            }
          }
          else {
            snprintf(local_38,0x18,"%d h",seconds / 0xe10 & 0xffffffff);
          }
        }
        else {
          snprintf(local_38,0x18,"%d d",(ulong)(uint)(int)((double)seconds / 86400.0));
        }
      }
      else {
        snprintf(local_38,0x18,"%d wk",(ulong)(uint)(int)(local_3c / 7.0));
      }
    }
    else {
      snprintf(local_38,0x18,"%1d mo",(ulong)(uint)(int)(local_3c / 30.0));
    }
  }
  else {
    snprintf(local_38,0x18,"%.1f y",(double)local_3c / 365.0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_38,&local_3d);
  std::allocator<char>::~allocator(&local_3d);
  return __return_storage_ptr__;
}

Assistant:

std::string formatTime (time_t seconds)
{
  char formatted[24];
  float days = (float) seconds / 86400.0;

       if (seconds >= 86400 * 365) snprintf (formatted, sizeof(formatted), "%.1f y", (days / 365.0));
  else if (seconds >= 86400 * 84)  snprintf (formatted, sizeof(formatted), "%1d mo", (int) (days / 30));
  else if (seconds >= 86400 * 13)  snprintf (formatted, sizeof(formatted), "%d wk",  (int) (float) (days / 7.0));
  else if (seconds >= 86400)       snprintf (formatted, sizeof(formatted), "%d d",   (int) days);
  else if (seconds >= 3600)        snprintf (formatted, sizeof(formatted), "%d h",   (int) (seconds / 3600));
  else if (seconds >= 60)          snprintf (formatted, sizeof(formatted), "%d m",   (int) (seconds / 60));
  else if (seconds >= 1)           snprintf (formatted, sizeof(formatted), "%d s",   (int) seconds);
#ifdef HAVE_STRLCPY
  else                             strlcpy (formatted, "-", sizeof(formatted));
#else
  else                             strcpy (formatted, "-");
#endif /* HAVE_STRLCPY */

  return std::string (formatted);
}